

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Stress::anon_unknown_0::BlendingCase::testFBO(BlendingCase *this)

{
  ostringstream *poVar1;
  TestLog *this_00;
  short sVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  GLuint uColorLoc;
  deUint32 dVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  pointer puVar11;
  undefined4 extraout_var;
  short sVar12;
  int x;
  long lVar13;
  size_t __n;
  ConstPixelBufferAccess *pCVar14;
  long lVar15;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int y;
  int x_00;
  long lVar16;
  ulong uVar17;
  pointer puVar18;
  TestContext *this_01;
  unsigned_short uVar19;
  unsigned_short uVar20;
  int x_2;
  int y_00;
  int y_1;
  int iVar21;
  float posX;
  float fVar22;
  float fVar23;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  allocator<char> local_4c0;
  allocator<char> local_4bf;
  allocator<char> local_4be;
  allocator<char> local_4bd;
  uint local_4bc;
  GLenum local_4b8;
  GLenum local_4b4;
  ulong local_4b0;
  long local_4a8;
  long local_4a0;
  GLenum *local_498;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  TextureFormat textureFormat;
  Surface errorMask;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  TextureLevel beforeImage;
  TextureLevel afterImage;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  Vec4 cAfter;
  UVec4 uniformValue;
  ConstPixelBufferAccess local_160;
  ConstPixelBufferAccess local_138;
  PixelBufferAccess local_110;
  PixelBufferAccess local_e8;
  Random rnd;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridVertices,0x1b5,(allocator_type *)&uniformValue);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,0x948,(allocator_type *)&uniformValue);
  textureFormat.type =
       (uint)(*(int *)&(this->super_FramebufferRenderCase).super_RenderCase.field_0x84 == 5) << 5 |
       UNORM_INT8;
  textureFormat.order = RGBA;
  tcu::TextureLevel::TextureLevel(&beforeImage,&textureFormat,0x100,0x100,1);
  tcu::TextureLevel::TextureLevel(&afterImage,&textureFormat,0x100,0x100,1);
  lVar10 = 8;
  for (lVar13 = 0; lVar13 != 0x17; lVar13 = lVar13 + 1) {
    fVar22 = (float)(int)lVar13 / 22.0;
    lVar15 = lVar10;
    for (lVar16 = 0; lVar16 != 0x13; lVar16 = lVar16 + 1) {
      fVar23 = (float)(int)lVar16 / 18.0;
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + -8) =
           fVar22 + fVar22 + -1.0;
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + -4) =
           fVar23 + fVar23 + -1.0;
      *(undefined8 *)
       ((long)(gridVertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar15) = 0x3f80000000000000;
      lVar15 = lVar15 + 0x10;
    }
    lVar10 = lVar10 + 0x130;
  }
  puVar11 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start + 5;
  sVar12 = 0;
  for (lVar10 = 0; puVar18 = puVar11, lVar13 = -0x12, lVar10 != 0x16; lVar10 = lVar10 + 1) {
    for (; lVar13 != 0; lVar13 = lVar13 + 1) {
      sVar2 = (short)lVar13;
      uVar19 = sVar12 + sVar2 + 0x12;
      puVar18[-5] = uVar19;
      uVar20 = sVar12 + 0x26 + sVar2;
      puVar18[-4] = uVar20;
      puVar18[-3] = sVar12 + 0x25 + sVar2;
      puVar18[-2] = uVar19;
      puVar18[-1] = uVar20;
      *puVar18 = sVar12 + sVar2 + 0x13;
      puVar18 = puVar18 + 6;
    }
    puVar11 = puVar11 + 0x6c;
    sVar12 = sVar12 + 0x13;
  }
  iVar4 = (*((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  uVar5 = (**(code **)(lVar10 + 0x780))
                    ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).
                     m_program,"a_pos");
  uColorLoc = (**(code **)(lVar10 + 0xb48))
                        ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->
                         m_program).m_program,"u_special");
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar10 + 0x1680))
            ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).m_program
            );
  (**(code **)(lVar10 + 0x5e0))(0xbe2);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"pre-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x613);
  (**(code **)(lVar10 + 0x19f0))
            (uVar5,4,0x1406,0,0,
             gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar10 + 0x610))(uVar5);
  uniformValue.m_data._0_8_ =
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(uniformValue.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Drawing pre-draw pattern.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TextureLevel::getAccess(&local_e8,&beforeImage);
  drawTestImage(this,&local_e8,uColorLoc,
                (int)((ulong)((long)gridVertices.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)gridVertices.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"pre-draw pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x61b);
  (**(code **)(lVar10 + 0x188))(0x4000);
  uVar17 = 0;
  while ((int)uVar17 != 5) {
    local_4b0 = uVar17;
    deRandom_init(&rnd.m_rnd,(int)uVar17 * 0x237 + 0x7b);
    uniformValue.m_data._0_8_ =
         ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(uniformValue.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Pass ");
    std::ostream::operator<<(poVar1,(int)local_4b0);
    std::operator<<((ostream *)poVar1,": Drawing tiles with the shader.\n");
    std::operator<<((ostream *)poVar1,"\tVarying u_special for each tile.\n");
    std::operator<<((ostream *)poVar1,"\tVarying blend function and blend equation for each tile.\n"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_4a8 = 0;
    for (lVar13 = 0; lVar13 != 0x16; lVar13 = lVar13 + 1) {
      local_4a0 = local_4a8;
      local_498 = testFBO::equations;
      for (uVar17 = 0; uVar17 != 0x12; uVar17 = uVar17 + 1) {
        local_4b4 = local_498[(uVar17 / 3) * -3];
        local_4b8 = testFBO::functions[(byte)(((ushort)uVar17 & 0xff) / 3)];
        local_4bc = de::Random::choose<unsigned_int,unsigned_int_const*>
                              ((Random *)&rnd.m_rnd,testFBO::functions,(uint *)&DAT_0183b5e8);
        uVar7 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          ((Random *)&rnd.m_rnd,&Stress::(anonymous_namespace)::s_specialFloats,
                           (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        uVar8 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          ((Random *)&rnd.m_rnd,&Stress::(anonymous_namespace)::s_specialFloats,
                           (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        uVar9 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          ((Random *)&rnd.m_rnd,&Stress::(anonymous_namespace)::s_specialFloats,
                           (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        uniformValue.m_data[3] =
             de::Random::choose<unsigned_int,unsigned_int_const*>
                       ((Random *)&rnd.m_rnd,&Stress::(anonymous_namespace)::s_specialFloats,
                        (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        uniformValue.m_data[1] = uVar8;
        uniformValue.m_data[0] = uVar7;
        uniformValue.m_data[2] = uVar9;
        (**(code **)(lVar10 + 0x15a8))(uColorLoc,1,&uniformValue);
        lVar15 = local_4a0;
        (**(code **)(lVar10 + 0x100))(local_4b4);
        (**(code **)(lVar10 + 0x120))(local_4b8,local_4bc);
        (**(code **)(lVar10 + 0x568))
                  (4,6,0x1403,
                   (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15);
        local_498 = local_498 + 1;
        local_4a0 = lVar15 + 0xc;
      }
      local_4a8 = local_4a8 + 0xd8;
    }
    uVar17 = (ulong)((int)local_4b0 + 1);
  }
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"special passes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x640);
  uniformValue.m_data._0_8_ =
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(uniformValue.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Drawing post-draw pattern.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TextureLevel::getAccess(&local_110,&afterImage);
  drawTestImage(this,&local_110,uColorLoc,
                (int)((ulong)((long)gridVertices.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)gridVertices.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"post-draw pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x645);
  (**(code **)(lVar10 + 0x518))(uVar5);
  (**(code **)(lVar10 + 0x1680))(0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  __n = 0x649;
  glu::checkError(dVar6,"OutputCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x649);
  tcu::Surface::Surface(&errorMask,0x100,0x100);
  uniformValue.m_data._0_8_ =
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(uniformValue.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Checking patterns are identical.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar4 = 0;
  for (iVar21 = 0; iVar21 < beforeImage.m_size.m_data[1]; iVar21 = iVar21 + 1) {
    for (y_00 = 0; y_00 < beforeImage.m_size.m_data[0]; y_00 = y_00 + 1) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&uniformValue,&beforeImage);
      x_00 = (int)(PixelBufferAccess *)&uniformValue;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&rnd,x_00,y_00,iVar21);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&uniformValue,&afterImage);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&cAfter,x_00,y_00,iVar21);
      bVar3 = tcu::Vector<float,_4>::operator!=
                        ((Vector<float,_4> *)&rnd,(Vector<float,_4> *)&cAfter);
      __n = 0xff00ff00;
      if (bVar3) {
        __n = 0xff0000ff;
      }
      iVar4 = iVar4 + (uint)bVar3;
      *(int *)((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar21 + y_00) * 4) =
           (int)__n;
    }
  }
  uniformValue.m_data._0_8_ =
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(uniformValue.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Found ");
  std::ostream::operator<<(poVar1,iVar4);
  std::operator<<((ostream *)poVar1," invalid pixel(s).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  this_01 = (this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx;
  if (iVar4 == 0) {
    description = "Pass";
  }
  else {
    this_00 = this_01->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"Results",&local_4bd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"Result verification",&local_4be);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&cAfter,&local_340,&local_360);
    iVar21 = (int)this_00;
    tcu::LogImageSet::write((LogImageSet *)&cAfter,iVar21,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"Pattern drawn before special float blending",&local_4bf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Pattern drawn before special float blending",&local_4c0);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_138,&beforeImage);
    pCVar14 = &local_138;
    tcu::LogImage::LogImage
              ((LogImage *)&uniformValue,&local_380,&local_3a0,pCVar14,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&uniformValue,iVar21,__buf_00,(size_t)pCVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"Pattern drawn after special float blending",&local_4c1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Pattern drawn after special float blending",&local_4c2);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_160,&afterImage);
    pCVar14 = &local_160;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,&local_3c0,&local_3e0,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&rnd,iVar21,__buf_01,(size_t)pCVar14);
    tcu::TestLog::endImageSet(this_00);
    tcu::LogImage::~LogImage((LogImage *)&rnd);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    tcu::LogImage::~LogImage((LogImage *)&uniformValue);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&cAfter);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    this_01 = (this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Image comparison failed";
  }
  tcu::TestContext::setTestResult(this_01,(uint)(iVar4 != 0),description);
  tcu::Surface::~Surface(&errorMask);
  tcu::TextureLevel::~TextureLevel(&afterImage);
  tcu::TextureLevel::~TextureLevel(&beforeImage);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridVertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return;
}

Assistant:

void BlendingCase::testFBO (void)
{
	static const GLenum equations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
	};
	static const GLenum functions[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
	};

	// Create a [BlendFuncs] X [s_specialFloats] grid of tiles. ( BlendFuncs = equations x functions )

	const int						numBlendFuncs	= DE_LENGTH_OF_ARRAY(equations) * DE_LENGTH_OF_ARRAY(functions);
	std::vector<tcu::Vec4>			gridVertices	((numBlendFuncs + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>			indices			(numBlendFuncs * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::TextureFormat				textureFormat	(tcu::TextureFormat::RGBA, (m_fboType == FBO_RGBA_FLOAT16) ? (tcu::TextureFormat::FLOAT) : (tcu::TextureFormat::UNORM_INT8));
	tcu::TextureLevel				beforeImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::TextureLevel				afterImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < numBlendFuncs + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats)] to [-1, 1]
		const float		posY	= (float)y / (float)numBlendFuncs * 2.0f - 1.0f;

		gridVertices[x * (numBlendFuncs + 1) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < numBlendFuncs; ++y)
	{
		const int baseNdx = (x * numBlendFuncs + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+1));
	}

	// Draw tiles
	{
		const int				numPasses	= 5;
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());
		gl.enable(GL_BLEND);
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw");

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		// draw "before" image
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing pre-draw pattern." << tcu::TestLog::EndMessage;
		drawTestImage(beforeImage.getAccess(), specialLoc, (int)gridVertices.size() - 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw pattern");

		// draw multiple passes with special floats
		gl.clear(GL_COLOR_BUFFER_BIT);
		for (int passNdx = 0; passNdx < numPasses; ++passNdx)
		{
			de::Random rnd(123 + 567 * passNdx);

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Pass " << passNdx << ": Drawing tiles with the shader.\n"
				<< "\tVarying u_special for each tile.\n"
				<< "\tVarying blend function and blend equation for each tile.\n"
				<< tcu::TestLog::EndMessage;

			// draw tiles
			for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
			for (int y = 0; y < numBlendFuncs; ++y)
			{
				const GLenum		blendEquation		= equations[y % DE_LENGTH_OF_ARRAY(equations)];
				const GLenum		blendFunction		= functions[y / DE_LENGTH_OF_ARRAY(equations)];
				const GLenum		blendFunctionDst	= rnd.choose<GLenum>(DE_ARRAY_BEGIN(functions), DE_ARRAY_END(functions));
				const int			indexIndex			= (x * numBlendFuncs + y) * 6;

				// "rnd.get"s are run in a deterministic order
				const deUint32		componentR			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentG			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentB			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentA			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const tcu::UVec4	uniformValue		= tcu::UVec4(componentR, componentG, componentB, componentA);

				gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
				gl.blendEquation(blendEquation);
				gl.blendFunc(blendFunction, blendFunctionDst);
				gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "special passes");

		// draw "after" image
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing post-draw pattern." << tcu::TestLog::EndMessage;
		drawTestImage(afterImage.getAccess(), specialLoc, (int)gridVertices.size() - 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw pattern");

		gl.disableVertexAttribArray(positionLoc);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "OutputCase::iterate");
	}

	// Check results
	{
		tcu::Surface		errorMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const tcu::RGBA		badPixelColor	= tcu::RGBA::red();
		const tcu::RGBA		okPixelColor	= tcu::RGBA::green();
		int					badPixels		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Checking patterns are identical." << tcu::TestLog::EndMessage;

		for (int y = 0; y < beforeImage.getHeight(); ++y)
		for (int x = 0; x < beforeImage.getWidth(); ++x)
		{
			const tcu::Vec4	cBefore	= beforeImage.getAccess().getPixel(x, y);
			const tcu::Vec4	cAfter	= afterImage.getAccess().getPixel(x, y);

			if (cBefore != cAfter)
			{
				++badPixels;
				errorMask.setPixel(x, y, badPixelColor);
			}
			else
				errorMask.setPixel(x, y, okPixelColor);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Found " << badPixels << " invalid pixel(s)." << tcu::TestLog::EndMessage;

		if (badPixels)
		{
			m_testCtx.getLog()
					<< tcu::TestLog::ImageSet("Results", "Result verification")
					<< tcu::TestLog::Image("Pattern drawn before special float blending",	"Pattern drawn before special float blending",		beforeImage)
					<< tcu::TestLog::Image("Pattern drawn after special float blending",	"Pattern drawn after special float blending",		afterImage)
					<< tcu::TestLog::EndImageSet;

			// all ok?
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
}